

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall cmDependsFortran::~cmDependsFortran(cmDependsFortran *this)

{
  cmDependsFortranInternals *this_00;
  cmDependsFortran *this_local;
  
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_00bea908;
  this_00 = this->Internal;
  if (this_00 != (cmDependsFortranInternals *)0x0) {
    cmDependsFortranInternals::~cmDependsFortranInternals(this_00);
    operator_delete(this_00,0x90);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->PPDefinitions);
  std::__cxx11::string::~string((string *)&this->SourceFile);
  cmDepends::~cmDepends(&this->super_cmDepends);
  return;
}

Assistant:

cmDependsFortran::~cmDependsFortran()
{
  delete this->Internal;
}